

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O0

Dim * __thiscall
dynet::PickElement::dim_forward
          (PickElement *this,vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  uint uVar1;
  size_type sVar2;
  invalid_argument *piVar3;
  const_reference pvVar4;
  ostream *poVar5;
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *in_RDX;
  long in_RSI;
  Dim *in_RDI;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  Dim *in_stack_fffffffffffff8b8;
  ostream *in_stack_fffffffffffff8c0;
  string local_698 [32];
  ostringstream local_678 [276];
  uint in_stack_fffffffffffffa9c;
  Dim *in_stack_fffffffffffffaa0;
  string local_4f8 [32];
  ostringstream local_4d8 [383];
  undefined1 local_359;
  string local_358 [32];
  ostringstream local_338 [383];
  undefined1 local_1b9;
  string local_1b8 [48];
  ostringstream local_188 [376];
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar2 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::size(in_RDX);
  if (sVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,"Failed input count check in PickElement");
    local_1b9 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar3,local_1b8);
    local_1b9 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = *(uint *)(in_RSI + 0x90);
  pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  if (pvVar4->nd <= uVar1) {
    std::__cxx11::ostringstream::ostringstream(local_338);
    poVar5 = std::operator<<((ostream *)local_338,"Tried to PickElement on dimension ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(uint *)(in_RSI + 0x90));
    std::operator<<(poVar5," bigger than input ");
    std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
    dynet::operator<<(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
    local_359 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar3,local_358);
    local_359 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  if (3 < pvVar4->nd) {
    std::__cxx11::ostringstream::ostringstream(local_4d8);
    std::operator<<((ostream *)local_4d8,
                    "PickElement not currently supported for tensors of 4 or more dimensions.");
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(piVar3,local_4f8);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
  memcpy(in_RDI,pvVar4,0x24);
  if (*(long *)(in_RSI + 0x88) != 0) {
    pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
    if (pvVar4->bd != 1) {
      pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
      uVar1 = pvVar4->bd;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x88));
      if (uVar1 != sVar2) {
        std::__cxx11::ostringstream::ostringstream(local_678);
        poVar5 = std::operator<<((ostream *)local_678,
                                 "Number of elements in the passed-in index vector (");
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x88))
        ;
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
        poVar5 = std::operator<<(poVar5,
                                 ") did not match number of elements in mini-batch elements in expression (of dimension "
                                );
        pvVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](local_10,0);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->bd);
        std::operator<<(poVar5,") in PickElement");
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::invalid_argument::invalid_argument(piVar3,local_698);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x88));
    in_RDI->bd = (uint)sVar2;
  }
  Dim::delete_dim(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
  return in_RDI;
}

Assistant:

Dim PickElement::dim_forward(const vector<Dim>& xs) const {
  DYNET_ARG_CHECK(xs.size() == 1, "Failed input count check in PickElement");
  DYNET_ARG_CHECK(dimension < xs[0].nd,
                          "Tried to PickElement on dimension " << dimension << " bigger than input " << xs[0]);
  DYNET_ARG_CHECK(xs[0].nd < 4,
                          "PickElement not currently supported for tensors of 4 or more dimensions.");
  
  Dim ret(xs[0]);
  if (pvals){
    DYNET_ARG_CHECK(xs[0].bd == 1 || xs[0].bd == pvals->size(),
                          "Number of elements in the passed-in index vector (" <<  pvals->size() << ")"
                            " did not match number of elements in mini-batch elements in expression (of dimension " << xs[0].bd << ") in PickElement");
    ret.bd = pvals->size();
  }

  ret.delete_dim(dimension);
  return ret;
}